

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall
QWidgetPrivate::paintBackground
          (QWidgetPrivate *this,QPainter *painter,QRegion *rgn,DrawWidgetFlags flags)

{
  QWidget *this_00;
  long lVar1;
  char cVar2;
  bool bVar3;
  QPalette *pQVar4;
  QBrush *pQVar5;
  QStyle *pQVar6;
  long in_FS_OFFSET;
  QBrush autoFillBrush;
  QBrush bg;
  undefined1 *local_80;
  undefined1 local_78 [16];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = QWidget::palette(this_00);
  QWidget::backgroundRole(this_00);
  pQVar5 = (QBrush *)QPalette::brush((ColorGroup)pQVar4,Dark);
  QBrush::QBrush((QBrush *)&local_80,pQVar5);
  if (((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
             super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 1) == 0) {
LAB_002fe4ad:
    bVar3 = false;
  }
  else {
    lVar1 = *(long *)(*(long *)&this_00->field_0x8 + 0x78);
    if ((lVar1 != 0) && ((*(byte *)(lVar1 + 0x7c) & 0x10) != 0)) {
      cVar2 = QBrush::isOpaque();
      if (cVar2 != '\0') goto LAB_002fe4ad;
    }
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar4 = QWidget::palette(this_00);
    pQVar5 = (QBrush *)QPalette::brush((ColorGroup)pQVar4,Dark);
    QBrush::QBrush((QBrush *)local_78,pQVar5);
    bVar3 = updateBrushOrigin(this,painter,(QBrush *)local_78);
    if ((char)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
              super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i < '\0') {
      fillRegion(painter,rgn,(QBrush *)local_78);
    }
    else {
      QPainter::compositionMode();
      QPainter::setCompositionMode((CompositionMode)painter);
      fillRegion(painter,rgn,(QBrush *)local_78);
      QPainter::setCompositionMode((CompositionMode)painter);
    }
    QBrush::~QBrush((QBrush *)local_78);
  }
  lVar1 = *(long *)(*(long *)&this_00->field_0x8 + 0x78);
  if ((lVar1 != 0) && ((*(byte *)(lVar1 + 0x7c) & 0x10) != 0)) {
    if (bVar3 == false) {
      updateBrushOrigin(this,painter,(QBrush *)&local_80);
    }
    fillRegion(painter,rgn,(QBrush *)&local_80);
  }
  if ((*(byte *)(*(long *)&this_00->field_0x8 + 0x247) & 0x20) != 0) {
    QPainter::setClipRegion((QRegion *)painter,(ClipOperation)rgn);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOption::QStyleOption((QStyleOption *)local_78,1,0);
    QStyleOption::initFrom((QStyleOption *)local_78,this_00);
    pQVar6 = QWidget::style(this_00);
    (**(code **)(*(long *)pQVar6 + 0xb0))(pQVar6,0x29,(QStyleOption *)local_78,painter,this_00);
    QStyleOption::~QStyleOption((QStyleOption *)local_78);
  }
  QBrush::~QBrush((QBrush *)&local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::paintBackground(QPainter *painter, const QRegion &rgn, DrawWidgetFlags flags) const
{
    Q_Q(const QWidget);

    bool brushOriginSet = false;
    const QBrush autoFillBrush = q->palette().brush(q->backgroundRole());

    if ((flags & DrawAsRoot) && !(q->autoFillBackground() && autoFillBrush.isOpaque())) {
        const QBrush bg = q->palette().brush(QPalette::Window);
        if (!brushOriginSet)
            brushOriginSet = updateBrushOrigin(painter, bg);
        if (!(flags & DontSetCompositionMode)) {
            //copy alpha straight in
            QPainter::CompositionMode oldMode = painter->compositionMode();
            painter->setCompositionMode(QPainter::CompositionMode_Source);
            fillRegion(painter, rgn, bg);
            painter->setCompositionMode(oldMode);
        } else {
            fillRegion(painter, rgn, bg);
        }
    }

    if (q->autoFillBackground()) {
        if (!brushOriginSet)
            brushOriginSet = updateBrushOrigin(painter, autoFillBrush);
        fillRegion(painter, rgn, autoFillBrush);
    }

    if (q->testAttribute(Qt::WA_StyledBackground)) {
        painter->setClipRegion(rgn);
        QStyleOption opt;
        opt.initFrom(q);
        q->style()->drawPrimitive(QStyle::PE_Widget, &opt, painter, q);
    }
}